

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocalSB::map
          (CCharmapToLocalSB *this,wchar_t unicode_char,char **output_ptr,size_t *output_len)

{
  uchar *__src;
  ulong *in_RCX;
  CCharmapToLocal *in_RDX;
  uchar *mapping;
  size_t map_len;
  size_t *in_stack_ffffffffffffffd0;
  size_t *local_8;
  
  __src = CCharmapToLocal::get_xlation
                    (in_RDX,(wchar_t)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
  if ((size_t *)*in_RCX < in_stack_ffffffffffffffd0) {
    *in_RCX = 0;
    local_8 = in_stack_ffffffffffffffd0;
  }
  else {
    memcpy((in_RDX->super_CCharmap)._vptr_CCharmap,__src,(size_t)in_stack_ffffffffffffffd0);
    (in_RDX->super_CCharmap)._vptr_CCharmap =
         (_func_int **)
         ((long)in_stack_ffffffffffffffd0 + (long)(in_RDX->super_CCharmap)._vptr_CCharmap);
    *in_RCX = *in_RCX - (long)in_stack_ffffffffffffffd0;
    local_8 = in_stack_ffffffffffffffd0;
  }
  return (size_t)local_8;
}

Assistant:

size_t CCharmapToLocalSB::map(wchar_t unicode_char, char **output_ptr,
                              size_t *output_len) const
{
    /* get the mapping */
    size_t map_len;
    const unsigned char *mapping = get_xlation(unicode_char, &map_len);
    
    /* if we don't have room for one more character, abort */
    if (*output_len < map_len)
    {
        *output_len = 0;
        return map_len;
    }
    
    /* copy the mapping */
    memcpy(*output_ptr, mapping, map_len);
    
    /* increment the pointer by the number of characters we copied */
    *output_ptr += map_len;

    /* adjust the remaining output length */
    *output_len -= map_len;
    
    /* return the size of the result */
    return map_len;
}